

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

uint sf::Texture::getMaximumSize(void)

{
  GLint GVar1;
  TransientContextLock transientLock;
  Lock lock;
  TransientContextLock local_11;
  Lock local_10;
  
  Lock::Lock(&local_10,(Mutex *)&(anonymous_namespace)::TextureImpl::maximumSizeMutex);
  if (getMaximumSize()::checked == '\0') {
    getMaximumSize()::checked = '\x01';
    GlResource::TransientContextLock::TransientContextLock(&local_11);
    priv::ensureExtensionsInit();
    (*sf_glad_glGetIntegerv)(0xd33,&getMaximumSize::size);
    GlResource::TransientContextLock::~TransientContextLock(&local_11);
  }
  GVar1 = getMaximumSize::size;
  Lock::~Lock(&local_10);
  return GVar1;
}

Assistant:

unsigned int Texture::getMaximumSize()
{
    Lock lock(TextureImpl::maximumSizeMutex);

    static bool checked = false;
    static GLint size = 0;

    if (!checked)
    {
        checked = true;

        TransientContextLock transientLock;

        // Make sure that extensions are initialized
        sf::priv::ensureExtensionsInit();

        glCheck(glGetIntegerv(GL_MAX_TEXTURE_SIZE, &size));
    }

    return static_cast<unsigned int>(size);
}